

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocumentContextExtenderAdapter.h
# Opt level: O0

EStatusCode __thiscall
DocumentContextExtenderAdapter::OnBeforeMergePageFromPage
          (DocumentContextExtenderAdapter *this,PDFPage *inTargetPage,
          PDFDictionary *inPageObjectDictionary,ObjectsContext *inPDFWriterObjectContext,
          DocumentContext *inDocumentContext,PDFDocumentHandler *inPDFDocumentHandler)

{
  PDFDocumentHandler *inPDFDocumentHandler_local;
  DocumentContext *inDocumentContext_local;
  ObjectsContext *inPDFWriterObjectContext_local;
  PDFDictionary *inPageObjectDictionary_local;
  PDFPage *inTargetPage_local;
  DocumentContextExtenderAdapter *this_local;
  
  return eSuccess;
}

Assistant:

virtual PDFHummus::EStatusCode OnBeforeMergePageFromPage(
							PDFPage* inTargetPage,
							PDFDictionary* inPageObjectDictionary,
							ObjectsContext* inPDFWriterObjectContext,
							PDFHummus::DocumentContext* inDocumentContext,
							PDFDocumentHandler* inPDFDocumentHandler){
	  (void) inTargetPage;
	  (void) inPageObjectDictionary;
	  (void) inPDFWriterObjectContext;
	  (void) inDocumentContext;
	  (void) inPDFDocumentHandler;
	  return PDFHummus::eSuccess;}